

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O2

void ipcmd_flush_msq(ipcmd_t *ipcmd)

{
  ssize_t sVar1;
  char dummy [128];
  
  if ((ipcmd != (ipcmd_t *)0x0) && (ipcmd->connection_error == 0)) {
    do {
      sVar1 = msgrcv(ipcmd->socket,dummy,0x80,1,0x800);
    } while (sVar1 != -1);
  }
  return;
}

Assistant:

void ipcmd_flush_msq(struct ipcmd_t* ipcmd)
{
  char dummy[128];

  if (ipcmd == NULL || ipcmd->connection_error)
    return;

  while (1)
  {
    if (msgrcv(ipcmd->socket, &dummy, 128, YPSPUR_MSG_CMD, IPC_NOWAIT) == -1)
    {
      break;
    }
  }
}